

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QHttpPart>::moveAppend
          (QGenericArrayOps<QHttpPart> *this,QHttpPart *b,QHttpPart *e)

{
  QHttpPart *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QHttpPart *in_RDI;
  QHttpPart *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QHttpPart>::begin((QArrayDataPointer<QHttpPart> *)0x2e7ea7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QHttpPart::QHttpPart(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d.d.ptr =
           (QHttpPartPrivate *)
           ((long)&((in_RDI[2].d.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }